

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O3

string * ApprovalTests::ApprovalTestNamer::getMisconfiguredMainHelp_abi_cxx11_(void)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string *in_RDI;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  HelpMessages::getMisconfiguredMainHelp_abi_cxx11_();
  plVar2 = (long *)::std::__cxx11::string::replace((ulong)local_30,0,(char *)0x0,0x1794f8);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)::std::__cxx11::string::append((char *)&local_50);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return in_RDI;
}

Assistant:

std::string ApprovalTestNamer::getMisconfiguredMainHelp()
    {
        return "\n\n" + HelpMessages::getMisconfiguredMainHelp() + "\n\n";
    }